

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutazioneI.cpp
# Opt level: O0

void __thiscall PermutazioneI::inserisci(PermutazioneI *this,PermutazioneI *p,Coppia *c)

{
  unsigned_short uVar1;
  unsigned_short tmp;
  Coppia *c_local;
  PermutazioneI *p_local;
  PermutazioneI *this_local;
  
  uVar1 = (p->super_Permutazione).individuo[c->x];
  if (c->x < c->y) {
    memmove((p->super_Permutazione).individuo + c->x,(p->super_Permutazione).individuo + (c->x + 1),
            (long)(c->y - c->x) << 1);
  }
  else {
    memmove((p->super_Permutazione).individuo + (c->y + 1),(p->super_Permutazione).individuo + c->y,
            (long)(c->x - c->y) << 1);
  }
  (p->super_Permutazione).individuo[c->y] = uVar1;
  return;
}

Assistant:

void PermutazioneI::inserisci(PermutazioneI* p, Coppia& c) {

	unsigned short tmp = p->individuo[c.x];

	if (c.x < c.y) {
		memmove(&p->individuo[c.x], &p->individuo[c.x+1], sizeof(unsigned short) * (c.y - c.x));
	}
	else {
		memmove(&p->individuo[c.y+1], &p->individuo[c.y], sizeof(unsigned short) * (c.x - c.y));
	}

	p->individuo[c.y] = tmp;
}